

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.hpp
# Opt level: O0

void __thiscall helics::PublicationInfo::~PublicationInfo(PublicationInfo *this)

{
  SmallBuffer *in_RDI;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  SmallBuffer::~SmallBuffer(in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  ~vector(unaff_retaddr);
  return;
}

Assistant:

PublicationInfo(GlobalHandle pid,
                    std::string_view pkey,
                    std::string_view ptype,
                    std::string_view punits): id(pid), key(pkey), type(ptype), units(punits)
    {
    }